

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::VarintSizeCases::~VarintSizeCases(VarintSizeCases *this)

{
  VarintSizeCases *this_local;
  
  testing::WithParamInterface<google::protobuf::io::(anonymous_namespace)::VarintSizeCase>::
  ~WithParamInterface(&this->
                       super_WithParamInterface<google::protobuf::io::(anonymous_namespace)::VarintSizeCase>
                     );
  CodedStreamTest::~CodedStreamTest(&this->super_CodedStreamTest);
  return;
}

Assistant:

TEST_P(VarintSizeCases, VarintSize32) {
  VarintSizeCase kVarintSizeCases_case = GetParam();
  if (kVarintSizeCases_case.value > 0xffffffffu) {
    // Skip 64-bit values.
    return;
  }

  EXPECT_EQ(kVarintSizeCases_case.size,
            CodedOutputStream::VarintSize32(
                static_cast<uint32_t>(kVarintSizeCases_case.value)));
}